

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O1

int Cnf_CutCountClauses(Aig_Man_t *p,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes,Vec_Int_t *vCover)

{
  void *pvVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  word Truth;
  ulong local_38;
  
  piVar6 = &vLeaves->nSize;
  if (vLeaves->nSize < 7) {
    local_38 = Cnf_CutDeriveTruth(p,vLeaves,vNodes);
    iVar3 = Kit_TruthIsop((uint *)&local_38,vLeaves->nSize,vCover,0);
    if (iVar3 < 0) {
      __assert_fail("RetValue >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                    ,0x1da,
                    "int Cnf_CutCountClauses(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)");
    }
    iVar3 = vCover->nSize;
    local_38 = ~local_38;
    iVar4 = Kit_TruthIsop((uint *)&local_38,*piVar6,vCover,0);
    if (iVar4 < 0) {
      __assert_fail("RetValue >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                    ,0x1e0,
                    "int Cnf_CutCountClauses(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)");
    }
    piVar6 = &vCover->nSize;
  }
  else {
    iVar3 = 1;
    if (0 < vNodes->nSize) {
      lVar5 = 0;
      do {
        pvVar1 = vNodes->pArray[lVar5];
        uVar2 = *(ulong *)((long)pvVar1 + 8);
        if (((uVar2 & 1) != 0) && ((*(byte *)((uVar2 & 0xfffffffffffffffe) + 0x18) & 0x10) == 0)) {
          puts("Unusual 1!");
        }
        uVar2 = *(ulong *)((long)pvVar1 + 0x10);
        if (((uVar2 & 1) != 0) && ((*(byte *)((uVar2 & 0xfffffffffffffffe) + 0x18) & 0x10) == 0)) {
          puts("Unusual 2!");
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < vNodes->nSize);
    }
  }
  return iVar3 + *piVar6;
}

Assistant:

int Cnf_CutCountClauses( Aig_Man_t * p, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes, Vec_Int_t * vCover )
{
    word Truth;
    Aig_Obj_t * pObj;
    int i, RetValue, nSize = 0;
    if ( Vec_PtrSize(vLeaves) > 6 )
    {
        // make sure this is an AND gate
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        {
            if ( Aig_ObjFaninC0(pObj) && !Aig_ObjFanin0(pObj)->fMarkA )
                printf( "Unusual 1!\n" );
            if ( Aig_ObjFaninC1(pObj) && !Aig_ObjFanin1(pObj)->fMarkA )
                printf( "Unusual 2!\n" );
            continue;

            assert( !Aig_ObjFaninC0(pObj) || Aig_ObjFanin0(pObj)->fMarkA );
            assert( !Aig_ObjFaninC1(pObj) || Aig_ObjFanin1(pObj)->fMarkA );
        }
        return Vec_PtrSize(vLeaves) + 1;
    }
    Truth = Cnf_CutDeriveTruth( p, vLeaves, vNodes );

    RetValue = Kit_TruthIsop( (unsigned *)&Truth, Vec_PtrSize(vLeaves), vCover, 0 );
    assert( RetValue >= 0 );
    nSize += Vec_IntSize(vCover);

    Truth = ~Truth;

    RetValue = Kit_TruthIsop( (unsigned *)&Truth, Vec_PtrSize(vLeaves), vCover, 0 );
    assert( RetValue >= 0 );
    nSize += Vec_IntSize(vCover);
    return nSize;
}